

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall SimpleLogger::LoggerStream::put(LoggerStream *this)

{
  int level;
  SimpleLogger *this_00;
  char *source_file;
  char *func_name;
  size_t line_number;
  undefined8 local_50 [4];
  
  this_00 = this->logger;
  if (this_00 != (SimpleLogger *)0x0) {
    level = this->level;
    source_file = this->file;
    func_name = this->func;
    line_number = this->line;
    std::__cxx11::stringbuf::str();
    SimpleLogger::put(this_00,level,source_file,func_name,line_number,"%s",local_50[0]);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

inline void put() {
            if (logger) {
                logger->put( level, file, func, line,
                             "%s", sStream.str().c_str() );
            }
        }